

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O0

_Bool xdr_string_decode(XDR *xdrs,char **cpp,u_int maxsize)

{
  _Bool _Var1;
  uint uVar2;
  uint uStack_34;
  _Bool ret;
  u_int nodesize;
  uint32_t size;
  char *sp;
  char **ppcStack_20;
  u_int maxsize_local;
  char **cpp_local;
  XDR *xdrs_local;
  
  _nodesize = *cpp;
  sp._4_4_ = maxsize;
  ppcStack_20 = cpp;
  cpp_local = (char **)xdrs;
  _Var1 = xdr_getuint32(xdrs,&stack0xffffffffffffffcc);
  if (_Var1) {
    if (sp._4_4_ < uStack_34) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s:%u ERROR size %u > max %u","xdr_string_decode",0x3ae,(ulong)uStack_34,
                   (ulong)sp._4_4_);
      }
      xdrs_local._7_1_ = false;
    }
    else {
      uVar2 = uStack_34 + 1;
      if (_nodesize == (char *)0x0) {
        _nodesize = (char *)(*__ntirpc_pkg_params.malloc_)
                                      ((ulong)uVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/ntirpc/rpc/xdr_inline.h"
                                       ,0x3c1,"xdr_string_decode");
      }
      xdrs_local._7_1_ = xdr_opaque_decode((XDR *)cpp_local,_nodesize,uStack_34);
      if (xdrs_local._7_1_) {
        _nodesize[uStack_34] = '\0';
        *ppcStack_20 = _nodesize;
      }
      else {
        mem_free(_nodesize,(ulong)uVar2);
      }
    }
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR size","xdr_string_decode",0x3a7);
    }
    xdrs_local._7_1_ = false;
  }
  return xdrs_local._7_1_;
}

Assistant:

static inline bool
xdr_string_decode(XDR *xdrs, char **cpp, u_int maxsize)
{
	char *sp = *cpp;	/* sp is the actual string pointer */
	uint32_t size;
	u_int nodesize;
	bool ret;

	/*
	 * first deal with the length since xdr strings are counted-strings
	 */
	if (!XDR_GETUINT32(xdrs, &size)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR size",
			__func__, __LINE__);
		return (false);
	}

	if (size > maxsize) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR size %" PRIu32 " > max %u",
			__func__, __LINE__,
			size, maxsize);
		return (false);
	}

	nodesize = (uint32_t)(size + 1);
	if (nodesize < (size + 1)) {
		/* caller provided very large maxsize */
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR overflow %" PRIu32,
			__func__, __LINE__,
			size);
		return (false);
	}

	/*
	 * now deal with the actual bytes
	 */
	if (!sp)
		sp = (char *)mem_alloc(nodesize);

	ret = xdr_opaque_decode(xdrs, sp, size);
	if (!ret) {
		mem_free(sp, nodesize);
		return (ret);
	}
	sp[size] = '\0';
	*cpp = sp;			/* only valid pointer */
	return (ret);
}